

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

WirehairResult __thiscall
wirehair::Codec::ReconstructOutput(Codec *this,void *message_out,uint64_t message_bytes)

{
  ushort uVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  WirehairResult WVar6;
  ulong uVar7;
  ushort uVar8;
  short sVar9;
  uint uVar10;
  ulong uVar11;
  uint i;
  long lVar12;
  uint uVar13;
  uint uVar14;
  PeelRow *pPVar15;
  uint uVar16;
  uint8_t *puVar17;
  PeelRowParameters params;
  PeelRowParameters local_66;
  int local_5c;
  ushort auStack_56 [3];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uint8_t *local_38;
  
  WVar6 = Wirehair_InvalidInput;
  if ((message_out != (void *)0x0) &&
     ((this->_block_count - 1) * this->_block_bytes + this->_output_final_bytes == message_bytes)) {
    local_38 = this->_copied_original;
    memset(local_38,0,(ulong)this->_block_count);
    uVar3 = this->_row_count;
    if (uVar3 != 0) {
      pPVar15 = this->_peel_rows;
      puVar17 = this->_input_blocks;
      uVar5 = this->_block_bytes;
      uVar8 = 0;
      do {
        uVar16 = pPVar15->RecoveryId;
        if (uVar16 < this->_block_count) {
          uVar10 = uVar5;
          if (uVar16 == this->_block_count - 1) {
            uVar10 = this->_output_final_bytes;
          }
          memcpy((void *)((ulong)(uVar5 * uVar16) + (long)message_out),puVar17,(ulong)uVar10);
          local_38[uVar16] = '\x01';
          uVar5 = this->_block_bytes;
          uVar3 = this->_row_count;
        }
        uVar8 = uVar8 + 1;
        pPVar15 = pPVar15 + 1;
        puVar17 = puVar17 + uVar5;
      } while (uVar8 < uVar3);
    }
    uVar3 = this->_block_count;
    uVar7 = (ulong)uVar3;
    WVar6 = Wirehair_Success;
    if (uVar3 != 0) {
      uVar5 = this->_block_bytes;
      uVar10 = (uint)uVar3;
      uVar11 = 0;
      uVar16 = uVar5;
      local_40 = uVar7;
      do {
        local_48 = uVar11 + 1;
        if (local_38[uVar11] == '\0') {
          uVar5 = this->_output_final_bytes;
          PeelRowParameters::Initialize
                    (&local_66,(uint32_t)uVar11,this->_p_seed,(uint16_t)uVar7,this->_mix_count);
          uVar2 = local_66.PeelAdd;
          local_50 = (ulong)local_66.MixFirst;
          uVar3 = this->_block_next_prime;
          uVar14 = (uint)local_66.PeelAdd;
          uVar8 = this->_mix_count;
          uVar1 = this->_mix_next_prime;
          lVar12 = 1;
          uVar7 = local_50;
          do {
            uVar7 = (ulong)(((uint)uVar7 & 0xffff) + (uint)local_66.MixAdd) % (ulong)uVar1;
            if ((uint)uVar8 <= (uint)uVar7) {
              uVar4 = (uint)uVar1 - (uint)uVar7;
              uVar13 = uVar4 & 0xffff;
              if (local_66.MixAdd < (ushort)uVar4) {
                uVar7 = (ulong)((uint)local_66.MixAdd * 0x10000 - uVar13) %
                        (ulong)(uint)local_66.MixAdd;
              }
              else {
                uVar7 = (ulong)(local_66.MixAdd - uVar13);
              }
            }
            auStack_56[lVar12] = (ushort)uVar7;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          uVar4 = this->_block_bytes;
          puVar17 = this->_recovery_blocks;
          if (local_48 == local_40) {
            uVar16 = uVar5;
          }
          if (local_66.PeelCount == 1) {
            gf256_addset_mem(message_out,puVar17 + uVar4 * local_66.PeelFirst,
                             puVar17 + uVar4 * (local_66.MixFirst + uVar10),uVar16);
          }
          else {
            uVar7 = (ulong)((uint)local_66.PeelFirst + (uint)local_66.PeelAdd) % (ulong)uVar3;
            if (uVar10 <= (uint)uVar7) {
              uVar5 = (uint)uVar3 - (uint)uVar7;
              uVar13 = uVar5 & 0xffff;
              if (local_66.PeelAdd < (ushort)uVar5) {
                uVar7 = (ulong)(uVar14 * 0x10000 - uVar13) % (ulong)uVar14;
              }
              else {
                uVar7 = (ulong)(local_66.PeelAdd - uVar13);
              }
            }
            sVar9 = local_66.PeelCount - 2;
            gf256_addset_mem(message_out,puVar17 + uVar4 * local_66.PeelFirst,
                             puVar17 + uVar4 * ((uint)uVar7 & 0xffff),uVar16);
            if (sVar9 != 0) {
              local_5c = uVar14 << 0x10;
              do {
                uVar7 = (ulong)(((uint)uVar7 & 0xffff) + uVar14) % (ulong)uVar3;
                if (uVar10 <= (uint)uVar7) {
                  uVar5 = (uint)uVar3 - (uint)uVar7;
                  uVar4 = uVar5 & 0xffff;
                  if (uVar2 < (ushort)uVar5) {
                    uVar7 = (ulong)(local_5c - uVar4) % (ulong)uVar14;
                  }
                  else {
                    uVar7 = (ulong)(uVar14 - uVar4);
                  }
                }
                sVar9 = sVar9 + -1;
                gf256_add_mem(message_out,
                              this->_recovery_blocks + ((uint)uVar7 & 0xffff) * this->_block_bytes,
                              uVar16);
              } while (sVar9 != 0);
            }
            gf256_add_mem(message_out,
                          this->_recovery_blocks + ((int)local_50 + uVar10) * this->_block_bytes,
                          uVar16);
          }
          uVar7 = (ulong)uVar10;
          gf256_add2_mem(message_out,
                         this->_recovery_blocks + (auStack_56[1] + uVar10) * this->_block_bytes,
                         this->_recovery_blocks + (auStack_56[2] + uVar10) * this->_block_bytes,
                         uVar16);
          uVar5 = this->_block_bytes;
        }
        message_out = (void *)((long)message_out + (ulong)uVar5);
        uVar11 = local_48;
      } while (local_48 != local_40);
      WVar6 = Wirehair_Success;
    }
  }
  return WVar6;
}

Assistant:

WirehairResult Codec::ReconstructOutput(
    void * GF256_RESTRICT message_out,
    uint64_t message_bytes)
{
    CAT_IF_DUMP(cout << endl << "---- ReconstructOutput ----" << endl << endl;)

    // Validate input
    if (!message_out) {
        return Wirehair_InvalidInput;
    }
    if (message_bytes != _block_bytes * (_block_count - 1) + _output_final_bytes) {
        CAT_DEBUG_BREAK();
        return Wirehair_InvalidInput;
    }
    uint8_t * GF256_RESTRICT output_blocks = reinterpret_cast<uint8_t *>( message_out );

#if defined(CAT_COPY_FIRST_N)
    // Re-purpose and initialize an array to store whether or not each row id needs to be regenerated
    uint8_t * GF256_RESTRICT copied_original = _copied_original;
    memset(copied_original, 0, _block_count);

    // Copy any original message rows that were received
    const uint8_t * GF256_RESTRICT src = _input_blocks;
    PeelRow * GF256_RESTRICT row = _peel_rows;

    // For each row:
    for (uint16_t row_i = 0; row_i < _row_count; ++row_i, ++row, src += _block_bytes)
    {
        const uint32_t block_id = row->RecoveryId;

        // If the row identifier indicates it is part of the original message data:
        if (block_id < _block_count)
        {
            CAT_IF_DUMP(cout << "Copying received row " << id << endl;)

            uint8_t * GF256_RESTRICT dest = output_blocks + _block_bytes * block_id;
            const unsigned bytes = (block_id != (unsigned)_block_count - 1) ? _block_bytes : _output_final_bytes;

            memcpy(dest, src, bytes);

            copied_original[block_id] = 1;
        }
    }
#endif // CAT_COPY_FIRST_N

    // Regenerate any rows that got lost:

    uint8_t * GF256_RESTRICT dest = output_blocks;
    unsigned block_bytes = _block_bytes;

    // For each block to generate:
    const uint16_t block_count = _block_count;
    for (uint32_t block_id = 0; block_id < block_count; ++block_id, dest += _block_bytes)
    {
#if defined(CAT_COPY_FIRST_N)
        // If already copied, skip it
        if (copied_original[block_id]) {
            continue;
        }
#endif // CAT_COPY_FIRST_N
        // For last row, use final byte count
        if (block_id + 1 == block_count) {
            block_bytes = _output_final_bytes;
        }

        CAT_IF_DUMP(cout << "Regenerating row " << row_i << ":";)

        PeelRowParameters params;
        params.Initialize(block_id, _p_seed, block_count, _mix_count);

        PeelRowIterator iter(params, block_count, _block_next_prime);
        const RowMixIterator mix(params, _mix_count, _mix_next_prime);

        const uint16_t peel_0 = iter.GetColumn();

        // Remember first column (there is always at least one)
        CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
        const uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

        CAT_IF_DUMP(cout << " " << peel_0;)

        // If peeler has multiple columns:
        if (iter.Iterate())
        {
            const uint16_t peel_1 = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_1;)

            // Combine first two columns into output buffer (faster than memcpy + memxor)
            CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);
            gf256_addset_mem(dest, first, _recovery_blocks + _block_bytes * peel_1, block_bytes);

            // For each remaining peeler column:
            while (iter.Iterate())
            {
                const uint16_t peel_x = iter.GetColumn();

                CAT_IF_DUMP(cout << " " << peel_x;)

                // Mix in each column
                CAT_DEBUG_ASSERT(peel_x < _recovery_rows);
                gf256_add_mem(dest, _recovery_blocks + _block_bytes * peel_x, block_bytes);
            }

            // Mix first mixer block in directly
            CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[0]) < _recovery_rows);
            gf256_add_mem(dest, _recovery_blocks + _block_bytes * (block_count + mix.Columns[0]), block_bytes);
        }
        else
        {
            // Mix first with first mixer block (faster than memcpy + memxor)
            CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[0]) < _recovery_rows);
            gf256_addset_mem(dest, first, _recovery_blocks + _block_bytes * (block_count + mix.Columns[0]), block_bytes);
        }

        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[0]);)

        // Combine remaining two mixer columns together:
        CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[1]) < _recovery_rows);
        const uint8_t *mix0_src = _recovery_blocks + _block_bytes * (block_count + mix.Columns[1]);
        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[1]);)

        CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[2]) < _recovery_rows);
        const uint8_t *mix1_src = _recovery_blocks + _block_bytes * (block_count + mix.Columns[2]);
        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[2]);)

        gf256_add2_mem(dest, mix0_src, mix1_src, block_bytes);

        CAT_IF_DUMP(cout << endl;)
    } // next row

    return Wirehair_Success;
}